

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_pattern
          (ansicolor_sink<spdlog::details::console_mutex> *this,string *pattern)

{
  string *in_RSI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff68;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *this_00;
  undefined8 local_71;
  allocator<char> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  pattern_time_type in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  pattern_formatter *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  operator_new(0xa8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RSI);
  this_00 = (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             in_stack_ffffffffffffffa8);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<std::default_delete<spdlog::formatter>,void>
            (this_00,(pointer)in_stack_ffffffffffffff68);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            (this_00,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                     in_stack_ffffffffffffff68);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr(this_00);
  std::__cxx11::string::~string((string *)((long)&local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20b920);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_pattern(const std::string &pattern)
{
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
}